

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_msgs.c
# Opt level: O1

void voutf(GlobalConfig *config,char *prefix,char *fmt,__va_list_tag *ap)

{
  int iVar1;
  size_t sVar2;
  char *__s;
  size_t sVar3;
  char *__s_00;
  ulong uVar4;
  ulong uVar5;
  
  sVar2 = strlen(prefix);
  if ((config->mute != false) || (__s = (char *)curl_mvaprintf(fmt,ap), __s == (char *)0x0)) {
    return;
  }
  sVar3 = strlen(__s);
  if (sVar3 != 0) {
    __s_00 = __s;
    do {
      fputs(prefix,(FILE *)config->errors);
      uVar4 = 0x4f - sVar2;
      if (0x4f - sVar2 < sVar3) {
        do {
          iVar1 = Curl_isspace((uint)(byte)__s_00[uVar4 - 1]);
          uVar5 = uVar4 - 1;
          if (uVar4 == 1) break;
          uVar4 = uVar5;
        } while (iVar1 == 0);
        if (uVar5 == 0) {
          uVar5 = 0x4e - sVar2;
        }
        fwrite(__s_00,uVar5 + 1,1,(FILE *)config->errors);
        fputs("\n",(FILE *)config->errors);
        __s_00 = __s_00 + uVar5 + 1;
        sVar3 = sVar3 - (uVar5 + 1);
      }
      else {
        fputs(__s_00,(FILE *)config->errors);
        sVar3 = 0;
      }
    } while (sVar3 != 0);
  }
  curl_free(__s);
  return;
}

Assistant:

static void voutf(struct GlobalConfig *config,
                  const char *prefix,
                  const char *fmt,
                  va_list ap)
{
  size_t width = (79 - strlen(prefix));
  if(!config->mute) {
    size_t len;
    char *ptr;
    char *print_buffer;

    print_buffer = curlx_mvaprintf(fmt, ap);
    if(!print_buffer)
      return;
    len = strlen(print_buffer);

    ptr = print_buffer;
    while(len > 0) {
      fputs(prefix, config->errors);

      if(len > width) {
        size_t cut = width-1;

        while(!ISSPACE(ptr[cut]) && cut) {
          cut--;
        }
        if(0 == cut)
          /* not a single cutting position was found, just cut it at the
             max text width then! */
          cut = width-1;

        (void)fwrite(ptr, cut + 1, 1, config->errors);
        fputs("\n", config->errors);
        ptr += cut + 1; /* skip the space too */
        len -= cut + 1;
      }
      else {
        fputs(ptr, config->errors);
        len = 0;
      }
    }
    curl_free(print_buffer);
  }
}